

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpMapMatrix.cpp
# Opt level: O3

void mnf::ExpMapMatrix::forceOnM_(RefVec *out,ConstRefVec *in)

{
  undefined1 (*pauVar1) [16];
  double dVar2;
  bool bVar3;
  undefined8 uVar4;
  PointerType ptr;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  double dVar21;
  CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_3b;
  Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
  local_38;
  RealScalar local_18;
  
  pauVar1 = (undefined1 (*) [16])
            (in->
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ).
            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            .m_data;
  local_18 = 0.1;
  local_38.m_lhs.m_matrix.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)pauVar1;
  local_38.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)pauVar1;
  bVar3 = Eigen::internal::
          isApprox_selector<Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_false>
          ::run(&local_38,&local_3b,&local_18);
  if ((bVar3) &&
     (dVar5 = *(double *)pauVar1[4],
     ABS((*(double *)*pauVar1 *
          (dVar5 * *(double *)pauVar1[2] - *(double *)(pauVar1[2] + 8) * *(double *)(pauVar1[3] + 8)
          ) - (*(double *)(*pauVar1 + 8) * dVar5 +
              -*(double *)(pauVar1[3] + 8) * *(double *)pauVar1[1]) * *(double *)(pauVar1[1] + 8)) +
         *(double *)pauVar1[3] *
         (*(double *)(*pauVar1 + 8) * *(double *)(pauVar1[2] + 8) -
         *(double *)pauVar1[1] * *(double *)pauVar1[2]) + -1.0) < 0.1)) {
    auVar18 = *pauVar1;
    dVar14 = *(double *)pauVar1[1];
    dVar21 = *(double *)(pauVar1[1] + 8);
    dVar2 = *(double *)pauVar1[2];
    dVar8 = *(double *)(pauVar1[2] + 8);
    dVar6 = *(double *)pauVar1[3];
    dVar7 = *(double *)(pauVar1[3] + 8);
    pauVar1 = *(undefined1 (**) [16])
               &out->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
    ;
    auVar10._0_8_ = dVar14 * dVar14 + auVar18._8_8_ * auVar18._8_8_ + auVar18._0_8_ * auVar18._0_8_;
    auVar10._8_8_ = 0;
    auVar11 = sqrtpd(auVar10,auVar10);
    auVar12._0_8_ = auVar11._0_8_;
    dVar14 = dVar14 / auVar12._0_8_;
    auVar12._8_8_ = auVar12._0_8_;
    auVar18 = divpd(auVar18,auVar12);
    *pauVar1 = auVar18;
    *(double *)pauVar1[1] = dVar14;
    dVar17 = auVar18._0_8_;
    dVar19 = auVar18._8_8_;
    dVar20 = dVar8 * dVar14 + dVar2 * dVar19 + dVar21 * dVar17;
    auVar13._0_8_ = dVar21 - dVar20 * dVar17;
    auVar13._8_8_ = dVar2 - dVar20 * dVar19;
    dVar8 = dVar8 - dVar14 * dVar20;
    dVar21 = dVar5 * dVar14 + dVar7 * dVar19 + dVar6 * dVar17;
    dVar6 = dVar6 - dVar21 * dVar17;
    dVar7 = dVar7 - dVar21 * dVar19;
    dVar5 = dVar5 - dVar14 * dVar21;
    auVar15._0_8_ = dVar8 * dVar8 + auVar13._8_8_ * auVar13._8_8_ + auVar13._0_8_ * auVar13._0_8_;
    auVar15._8_8_ = 0;
    auVar18 = sqrtpd(auVar15,auVar15);
    auVar16._0_8_ = auVar18._0_8_;
    dVar8 = dVar8 / auVar16._0_8_;
    auVar16._8_8_ = auVar16._0_8_;
    auVar11 = divpd(auVar13,auVar16);
    *(undefined1 (*) [16])(pauVar1[1] + 8) = auVar11;
    *(double *)(pauVar1[2] + 8) = dVar8;
    dVar14 = dVar5 * dVar8 + dVar7 * auVar11._8_8_ + dVar6 * auVar11._0_8_;
    auVar18._0_8_ = dVar6 - dVar14 * auVar11._0_8_;
    auVar18._8_8_ = dVar7 - dVar14 * auVar11._8_8_;
    dVar5 = dVar5 - dVar8 * dVar14;
    auVar11._0_8_ = dVar5 * dVar5 + auVar18._8_8_ * auVar18._8_8_ + auVar18._0_8_ * auVar18._0_8_;
    auVar11._8_8_ = 0;
    auVar11 = sqrtpd(auVar11,auVar11);
    auVar9._0_8_ = auVar11._0_8_;
    auVar9._8_8_ = auVar9._0_8_;
    auVar18 = divpd(auVar18,auVar9);
    pauVar1[3] = auVar18;
    *(double *)pauVar1[4] = dVar5 / auVar9._0_8_;
    return;
  }
  uVar4 = __cxa_allocate_exception(1);
  __cxa_throw(uVar4,&mnf_exception::typeinfo,0);
}

Assistant:

void ExpMapMatrix::forceOnM_(RefVec out, const ConstRefVec& in)
{
  toConstMat3 inMat(in.data());
  mnf_assert(
      (inMat.transpose() * inMat).isApprox(Eigen::Matrix3d::Identity(), 0.1) &&
      fabs(inMat.determinant() - 1.0) < 0.1 &&
      "Provided matrix is too far from being a rotation matrix. You should use "
      "createRandomPoint instead of forceOnM");
  Eigen::Matrix3d A(
      inMat);  // TODO it is bad to copy it here. Maybe in shouldn't be const???
  toMat3 Q(out.data());
  Eigen::Matrix3d R;
  // the following scope contains the code to compute a QR on R3x3
  {
    // k = 0
    R(0, 0) = A.col(0).norm();
    Q.col(0) = A.col(0) / R(0, 0);
    // j = 1
    R(0, 1) = Q.col(0).dot(A.col(1));
    A.col(1) = A.col(1) - Q.col(0) * R(0, 1);
    // j = 2
    R(0, 2) = Q.col(0).dot(A.col(2));
    A.col(2) = A.col(2) - Q.col(0) * R(0, 2);
    // k = 1
    R(1, 1) = A.col(1).norm();
    Q.col(1) = A.col(1) / R(1, 1);
    // j = 2
    R(1, 2) = Q.col(1).dot(A.col(2));
    A.col(2) = A.col(2) - Q.col(1) * R(1, 2);
    // k = 2
    R(2, 2) = A.col(2).norm();
    Q.col(2) = A.col(2) / R(2, 2);
  }
}